

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharedRenderingPerfTests.cpp
# Opt level: O2

void __thiscall deqp::egl::anon_unknown_0::TestThread::run(TestThread *this)

{
  pointer ppTVar1;
  TestContext *pTVar2;
  GLenum err;
  deUint32 err_00;
  deUint64 dVar3;
  Library *pLVar4;
  long lVar5;
  int frameNdx;
  int iVar6;
  int callNdx;
  int iVar7;
  
  dVar3 = deGetMicroseconds();
  this->m_beginTimeUs = dVar3;
  for (lVar5 = 0;
      ppTVar1 = (this->m_contexts).
                super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      lVar5 < (int)((ulong)((long)(this->m_contexts).
                                  super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1) >> 3);
      lVar5 = lVar5 + 1) {
    pTVar2 = ppTVar1[lVar5];
    pLVar4 = EglTestContext::getLibrary(pTVar2->m_testCtx);
    (*pLVar4->_vptr_Library[0x27])(pLVar4,pTVar2->m_eglDisplay,pTVar2->m_eglSurface);
    for (iVar6 = 0; iVar6 < (pTVar2->m_config).frameCount; iVar6 = iVar6 + 1) {
      (*(pTVar2->m_gl).clearColor)(0.75,0.6,0.5,1.0);
      (*(pTVar2->m_gl).clear)(0x4100);
      for (iVar7 = 0; iVar7 < (pTVar2->m_config).drawCallCount; iVar7 = iVar7 + 1) {
        (*(pTVar2->m_gl).useProgram)(pTVar2->m_program);
        (*(pTVar2->m_gl).enableVertexAttribArray)(pTVar2->m_coordLoc);
        if ((pTVar2->m_config).useCoordBuffer == true) {
          (*(pTVar2->m_gl).bindBuffer)(0x8892,pTVar2->m_coordBuffer);
          (*(pTVar2->m_gl).vertexAttribPointer)(pTVar2->m_coordLoc,2,0x1406,'\0',0,(void *)0x0);
          (*(pTVar2->m_gl).bindBuffer)(0x8892,0);
        }
        else {
          (*(pTVar2->m_gl).vertexAttribPointer)
                    (pTVar2->m_coordLoc,2,0x1406,'\0',0,
                     (pTVar2->m_coordData).super__Vector_base<float,_std::allocator<float>_>._M_impl
                     .super__Vector_impl_data._M_start);
        }
        if ((pTVar2->m_config).useTexture == true) {
          (*(pTVar2->m_gl).bindTexture)(0xde1,pTVar2->m_texture);
          (*(pTVar2->m_gl).uniform1i)(pTVar2->m_textureLoc,0);
        }
        if ((pTVar2->m_config).useIndices == true) {
          if ((pTVar2->m_config).useIndexBuffer == true) {
            (*(pTVar2->m_gl).bindBuffer)(0x8893,pTVar2->m_indexBuffer);
            (*(pTVar2->m_gl).drawElements)(4,(pTVar2->m_config).triangleCount,0x1403,(void *)0x0);
          }
          else {
            (*(pTVar2->m_gl).drawElements)
                      (4,(pTVar2->m_config).triangleCount,0x1403,
                       (pTVar2->m_indexData).
                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                       super__Vector_impl_data._M_start);
          }
        }
        else {
          (*(pTVar2->m_gl).drawArrays)(4,0,(pTVar2->m_config).triangleCount);
        }
        if ((pTVar2->m_config).useTexture == true) {
          (*(pTVar2->m_gl).bindTexture)(0xde1,0);
        }
        (*(pTVar2->m_gl).disableVertexAttribArray)(pTVar2->m_coordLoc);
        (*(pTVar2->m_gl).useProgram)(0);
      }
      (*pLVar4->_vptr_Library[0x31])(pLVar4,pTVar2->m_eglDisplay,pTVar2->m_eglSurface);
    }
    (*(pTVar2->m_gl).finish)();
    err = (*(pTVar2->m_gl).getError)();
    glu::checkError(err,"glFinish()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharedRenderingPerfTests.cpp"
                    ,0x2c9);
    (*pLVar4->_vptr_Library[0x27])(pLVar4,pTVar2->m_eglDisplay,0,0,0);
    err_00 = (*pLVar4->_vptr_Library[0x1f])(pLVar4);
    eglu::checkError(err_00,
                     "makeCurrent(m_eglDisplay, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharedRenderingPerfTests.cpp"
                     ,0x2ca);
  }
  this->m_isOk = true;
  dVar3 = deGetMicroseconds();
  this->m_endTimeUs = dVar3;
  return;
}

Assistant:

void TestThread::run (void)
{
	try
	{
		m_beginTimeUs = deGetMicroseconds();

		for (int contextNdx = 0; contextNdx < (int)m_contexts.size(); contextNdx++)
			m_contexts[contextNdx]->render();

		m_isOk		= true;
		m_endTimeUs = deGetMicroseconds();
	}
	catch (const std::runtime_error& error)
	{
		m_isOk			= false;
		m_errorString	= error.what();
	}
	catch (...)
	{
		m_isOk			= false;
		m_errorString	= "Got unknown exception";
	}
}